

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O3

RPCHelpMan * analyzepsbt(void)

{
  size_type *psVar1;
  string name;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string name_00;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_18;
  RPCArgOptions opts;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  RPCHelpMan *in_RDI;
  long lVar15;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  undefined4 in_stack_ffffffffffffec48;
  undefined4 uVar16;
  undefined4 in_stack_ffffffffffffec4c;
  undefined1 in_stack_ffffffffffffec50 [16];
  undefined8 in_stack_ffffffffffffec68;
  undefined8 in_stack_ffffffffffffec70;
  undefined8 in_stack_ffffffffffffec78;
  code *pcVar17;
  undefined8 in_stack_ffffffffffffec80;
  undefined1 in_stack_ffffffffffffec88 [16];
  pointer in_stack_ffffffffffffec98;
  pointer pRVar18;
  pointer in_stack_ffffffffffffeca0;
  pointer pRVar19;
  pointer in_stack_ffffffffffffeca8;
  pointer pRVar20;
  pointer in_stack_ffffffffffffecb0;
  pointer in_stack_ffffffffffffecb8;
  pointer pRVar21;
  pointer in_stack_ffffffffffffecc0;
  pointer pRVar22;
  pointer in_stack_ffffffffffffecc8;
  pointer pRVar23;
  undefined8 in_stack_ffffffffffffecd0;
  pointer in_stack_ffffffffffffecd8;
  pointer in_stack_ffffffffffffece0;
  pointer in_stack_ffffffffffffece8;
  undefined8 in_stack_ffffffffffffecf0;
  pointer in_stack_ffffffffffffecf8;
  pointer in_stack_ffffffffffffed00;
  pointer in_stack_ffffffffffffed08;
  undefined8 in_stack_ffffffffffffed10;
  pointer in_stack_ffffffffffffed18;
  pointer in_stack_ffffffffffffed20;
  pointer in_stack_ffffffffffffed28;
  allocator_type local_12ca;
  allocator_type local_12c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12c8;
  allocator_type local_12a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12a8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1288;
  allocator_type local_1269;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1268;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1248;
  allocator_type local_1229;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1228;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1208;
  vector<RPCResult,_std::allocator<RPCResult>_> local_11f0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_11d8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_11b8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1198;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1180;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1168;
  RPCResults local_1150;
  allocator_type local_1131;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1130;
  string local_1118;
  string local_10f8;
  string local_10d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10b8;
  size_type local_10b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10a8;
  long *local_1098 [2];
  long local_1088 [2];
  long *local_1078 [2];
  long local_1068 [2];
  long *local_1058 [2];
  long local_1048 [2];
  long *local_1038;
  undefined8 local_1030;
  long local_1028 [2];
  long *local_1018 [2];
  long local_1008 [2];
  long *local_ff8 [2];
  long local_fe8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fd8;
  size_type *local_fb8;
  size_type local_fb0;
  size_type local_fa8;
  undefined8 uStack_fa0;
  long *local_f98 [2];
  long local_f88 [2];
  long *local_f78 [2];
  long local_f68 [2];
  long *local_f58 [2];
  long local_f48 [2];
  long *local_f38 [2];
  long local_f28 [2];
  long *local_f18 [2];
  long local_f08 [2];
  long *local_ef8 [2];
  long local_ee8 [2];
  long *local_ed8 [2];
  long local_ec8 [2];
  long *local_eb8 [2];
  long local_ea8 [2];
  long *local_e98 [2];
  long local_e88 [2];
  long *local_e78 [2];
  long local_e68 [2];
  long *local_e58 [2];
  long local_e48 [2];
  RPCResult local_e38;
  long *local_db0 [2];
  long local_da0 [2];
  long *local_d90 [2];
  long local_d80 [2];
  long *local_d70 [2];
  long local_d60 [2];
  long *local_d50 [2];
  long local_d40 [2];
  undefined1 local_d30 [120];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_cb8;
  long *local_ca8 [2];
  long local_c98 [2];
  long *local_c88 [2];
  long local_c78 [2];
  RPCResult local_c68;
  RPCResult local_be0;
  RPCResult local_b58;
  RPCResult local_ad0;
  long *local_a48 [2];
  long local_a38 [2];
  long *local_a28 [2];
  long local_a18 [2];
  long *local_a08 [2];
  long local_9f8 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_9e8;
  long *local_9c8 [2];
  long local_9b8 [2];
  pointer local_9a8 [2];
  undefined1 local_998 [152];
  RPCResult local_900;
  RPCResult local_878;
  RPCResult local_7f0;
  long *local_768 [2];
  long local_758 [2];
  long *local_748 [2];
  long local_738 [2];
  undefined1 local_728 [120];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6b0;
  long *local_6a0 [2];
  long local_690 [2];
  long *local_680 [2];
  long local_670 [2];
  RPCResult local_660;
  RPCResult local_5d8;
  RPCResult local_550;
  RPCResult local_4c8;
  RPCResult local_440;
  RPCResult local_3b8;
  long *local_330 [2];
  long local_320 [2];
  long *local_310 [2];
  long local_300 [2];
  RPCResult local_2f0;
  undefined1 local_268;
  undefined1 *local_260;
  undefined8 local_258;
  undefined1 local_250;
  undefined7 uStack_24f;
  undefined1 local_240 [32];
  long *local_220 [2];
  long local_210 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_200;
  undefined1 local_1a8;
  long *local_1a0 [2];
  long local_190 [2];
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_1030 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"analyzepsbt","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nAnalyzes and provides information about the current status of a PSBT and its inputs\n"
             ,"");
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"psbt","");
  local_200._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_1a8 = 0;
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_220,"A base64 string of a PSBT","");
  local_260 = &local_250;
  local_268 = 0;
  local_258 = 0;
  local_250 = 0;
  local_240._0_8_ = (pointer)0x0;
  local_240._8_2_ = 0;
  local_240._10_6_ = 0;
  local_240._16_2_ = 0;
  local_240._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffec4c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffec48;
  name._8_16_ = in_stack_ffffffffffffec50;
  name.field_2._8_8_ = in_RDI;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffec70;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffec68;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffec78;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffec80;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffec88;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffec98;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffeca0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffeca8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffecb0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffecb8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffecc0;
  description_18._M_string_length = in_stack_ffffffffffffecd0;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffecc8;
  description_18.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffecd8;
  description_18.field_2._8_8_ = in_stack_ffffffffffffece0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffecf0;
  opts._0_8_ = in_stack_ffffffffffffece8;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffecf8;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffed00;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffed08;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffed10;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffed18;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffed20;
  opts._64_8_ = in_stack_ffffffffffffed28;
  RPCArg::RPCArg(&local_180,name,(Type)local_1a0,fallback,description_18,opts);
  __l._M_len = 1;
  __l._M_array = &local_180;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1130,__l,&local_1131);
  local_310[0] = local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"");
  local_330[0] = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"");
  local_680[0] = local_670;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_680,"inputs","");
  local_6a0[0] = local_690;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a0,"");
  local_748[0] = local_738;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"");
  local_768[0] = local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_768,"");
  local_9a8[0] = (pointer)local_998;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9a8,"has_utxo","");
  local_9c8[0] = local_9b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9c8,"Whether a UTXO is provided","");
  local_11b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_11b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_11b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffec4c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffec48;
  m_key_name._8_16_ = in_stack_ffffffffffffec50;
  m_key_name.field_2._8_8_ = in_RDI;
  description._M_string_length = in_stack_ffffffffffffec70;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec68;
  description.field_2._M_allocated_capacity = in_stack_ffffffffffffec78;
  description.field_2._8_8_ = in_stack_ffffffffffffec80;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffec98;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffec88._0_8_;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffec88._8_8_;
  RPCResult::RPCResult
            ((RPCResult *)(local_998 + 0x10),BOOL,m_key_name,description,inner,SUB81(local_9a8,0));
  local_9e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_9e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9e8,"is_final","");
  local_a08[0] = local_9f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a08,"Whether the input is finalized","");
  local_11d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_11d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_11d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffec4c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffec48;
  m_key_name_00._8_16_ = in_stack_ffffffffffffec50;
  m_key_name_00.field_2._8_8_ = in_RDI;
  description_00._M_string_length = in_stack_ffffffffffffec70;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec68;
  description_00.field_2._M_allocated_capacity = in_stack_ffffffffffffec78;
  description_00.field_2._8_8_ = in_stack_ffffffffffffec80;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec98;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec88._0_8_;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec88._8_8_;
  RPCResult::RPCResult(&local_900,BOOL,m_key_name_00,description_00,inner_00,SUB81(&local_9e8,0));
  local_a28[0] = local_a18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a28,"missing","");
  local_a48[0] = local_a38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a48,"Things that are missing that are required to complete this input",
             "");
  local_c88[0] = local_c78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c88,"pubkeys","");
  local_ca8[0] = local_c98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ca8,"");
  local_d50[0] = local_d40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d50,"keyid","");
  local_d70[0] = local_d60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d70,
             "Public key ID, hash160 of the public key, of a public key whose BIP 32 derivation path is missing"
             ,"");
  local_1228.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1228.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1228.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffec4c;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffec48;
  m_key_name_01._8_16_ = in_stack_ffffffffffffec50;
  m_key_name_01.field_2._8_8_ = in_RDI;
  description_01._M_string_length = in_stack_ffffffffffffec70;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec68;
  description_01.field_2._M_allocated_capacity = in_stack_ffffffffffffec78;
  description_01.field_2._8_8_ = in_stack_ffffffffffffec80;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec98;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec88._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec88._8_8_;
  RPCResult::RPCResult
            ((RPCResult *)local_d30,STR_HEX,m_key_name_01,description_01,inner_01,SUB81(local_d50,0)
            );
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_d30;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1208,__l_00,&local_1229);
  uVar16 = 0;
  auVar2._4_16_ = in_stack_ffffffffffffec50;
  auVar2._0_4_ = in_stack_ffffffffffffec4c;
  auVar2._20_8_ = in_RDI;
  auVar2._28_4_ = 0;
  description_02._M_string_length = in_stack_ffffffffffffec70;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec68;
  description_02.field_2._M_allocated_capacity = in_stack_ffffffffffffec78;
  description_02.field_2._8_8_ = in_stack_ffffffffffffec80;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec98;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec88._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec88._8_8_;
  RPCResult::RPCResult
            (&local_c68,ARR,(string)(auVar2 << 0x20),SUB81(local_c88,0),description_02,inner_02,true
            );
  local_d90[0] = local_d80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d90,"signatures","");
  local_db0[0] = local_da0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_db0,"");
  local_e58[0] = local_e48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e58,"keyid","");
  local_e78[0] = local_e68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e78,
             "Public key ID, hash160 of the public key, of a public key whose signature is missing",
             "");
  local_1268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffec4c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar16;
  m_key_name_02._8_16_ = in_stack_ffffffffffffec50;
  m_key_name_02.field_2._8_8_ = in_RDI;
  description_03._M_string_length = in_stack_ffffffffffffec70;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec68;
  description_03.field_2._M_allocated_capacity = in_stack_ffffffffffffec78;
  description_03.field_2._8_8_ = in_stack_ffffffffffffec80;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec98;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec88._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec88._8_8_;
  RPCResult::RPCResult(&local_e38,STR_HEX,m_key_name_02,description_03,inner_03,SUB81(local_e58,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_e38;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1248,__l_01,&local_1269);
  auVar3._4_16_ = in_stack_ffffffffffffec50;
  auVar3._0_4_ = in_stack_ffffffffffffec4c;
  auVar3._20_8_ = in_RDI;
  auVar3._28_4_ = 0;
  description_04._M_string_length = in_stack_ffffffffffffec70;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec68;
  description_04.field_2._M_allocated_capacity = in_stack_ffffffffffffec78;
  description_04.field_2._8_8_ = in_stack_ffffffffffffec80;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec98;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec88._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec88._8_8_;
  RPCResult::RPCResult
            (&local_be0,ARR,(string)(auVar3 << 0x20),SUB81(local_d90,0),description_04,inner_04,true
            );
  local_e98[0] = local_e88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e98,"redeemscript","");
  local_eb8[0] = local_ea8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_eb8,"Hash160 of the redeem script that is missing","");
  local_1288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar4._4_16_ = in_stack_ffffffffffffec50;
  auVar4._0_4_ = in_stack_ffffffffffffec4c;
  auVar4._20_8_ = in_RDI;
  auVar4._28_4_ = 0;
  description_05._M_string_length = in_stack_ffffffffffffec70;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec68;
  description_05.field_2._M_allocated_capacity = in_stack_ffffffffffffec78;
  description_05.field_2._8_8_ = in_stack_ffffffffffffec80;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec98;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec88._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec88._8_8_;
  RPCResult::RPCResult
            (&local_b58,STR_HEX,(string)(auVar4 << 0x20),SUB81(local_e98,0),description_05,inner_05,
             true);
  local_ed8[0] = local_ec8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ed8,"witnessscript","");
  local_ef8[0] = local_ee8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ef8,"SHA256 of the witness script that is missing","");
  local_12a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar5._4_16_ = in_stack_ffffffffffffec50;
  auVar5._0_4_ = in_stack_ffffffffffffec4c;
  auVar5._20_8_ = in_RDI;
  auVar5._28_4_ = 0;
  description_06._M_string_length = in_stack_ffffffffffffec70;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec68;
  description_06.field_2._M_allocated_capacity = in_stack_ffffffffffffec78;
  description_06.field_2._8_8_ = in_stack_ffffffffffffec80;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec98;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec88._0_8_;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec88._8_8_;
  RPCResult::RPCResult
            (&local_ad0,STR_HEX,(string)(auVar5 << 0x20),SUB81(local_ed8,0),description_06,inner_06,
             true);
  __l_02._M_len = 4;
  __l_02._M_array = &local_c68;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_11f0,__l_02,&local_12a9);
  auVar6._4_16_ = in_stack_ffffffffffffec50;
  auVar6._0_4_ = in_stack_ffffffffffffec4c;
  auVar6._20_8_ = in_RDI;
  auVar6._28_4_ = 0;
  description_07._M_string_length = in_stack_ffffffffffffec70;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec68;
  description_07.field_2._M_allocated_capacity = in_stack_ffffffffffffec78;
  description_07.field_2._8_8_ = in_stack_ffffffffffffec80;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec98;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec88._0_8_;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec88._8_8_;
  RPCResult::RPCResult
            (&local_878,OBJ,(string)(auVar6 << 0x20),SUB81(local_a28,0),description_07,inner_07,true
            );
  local_f18[0] = local_f08;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f18,"next","");
  local_f38[0] = local_f28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f38,"Role of the next person that this input needs to go to","");
  local_12c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar16 = 0;
  auVar7._4_16_ = in_stack_ffffffffffffec50;
  auVar7._0_4_ = in_stack_ffffffffffffec4c;
  auVar7._20_8_ = in_RDI;
  auVar7._28_4_ = 0;
  description_08._M_string_length = in_stack_ffffffffffffec70;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec68;
  description_08.field_2._M_allocated_capacity = in_stack_ffffffffffffec78;
  description_08.field_2._8_8_ = in_stack_ffffffffffffec80;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec98;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec88._0_8_;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec88._8_8_;
  RPCResult::RPCResult
            (&local_7f0,STR,(string)(auVar7 << 0x20),SUB81(local_f18,0),description_08,inner_08,true
            );
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)(local_998 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1198,__l_03,&local_12c9);
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffec4c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar16;
  m_key_name_03._8_16_ = in_stack_ffffffffffffec50;
  m_key_name_03.field_2._8_8_ = in_RDI;
  description_09._M_string_length = in_stack_ffffffffffffec70;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec68;
  description_09.field_2._M_allocated_capacity = in_stack_ffffffffffffec78;
  description_09.field_2._8_8_ = in_stack_ffffffffffffec80;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec98;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec88._0_8_;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec88._8_8_;
  RPCResult::RPCResult
            ((RPCResult *)local_728,OBJ,m_key_name_03,description_09,inner_09,SUB81(local_748,0));
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)local_728;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1180,__l_04,&local_12ca);
  auVar8._4_16_ = in_stack_ffffffffffffec50;
  auVar8._0_4_ = in_stack_ffffffffffffec4c;
  auVar8._20_8_ = in_RDI;
  auVar8._28_4_ = 0;
  description_10._M_string_length = in_stack_ffffffffffffec70;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec68;
  description_10.field_2._M_allocated_capacity = in_stack_ffffffffffffec78;
  description_10.field_2._8_8_ = in_stack_ffffffffffffec80;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec98;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec88._0_8_;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec88._8_8_;
  RPCResult::RPCResult
            (&local_660,ARR,(string)(auVar8 << 0x20),SUB81(local_680,0),description_10,inner_10,true
            );
  local_f58[0] = local_f48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f58,"estimated_vsize","");
  local_f78[0] = local_f68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f78,"Estimated vsize of the final signed transaction","");
  auVar9._4_16_ = in_stack_ffffffffffffec50;
  auVar9._0_4_ = in_stack_ffffffffffffec4c;
  auVar9._20_8_ = in_RDI;
  auVar9._28_4_ = 0;
  description_11._M_string_length = in_stack_ffffffffffffec70;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec68;
  description_11.field_2._M_allocated_capacity = in_stack_ffffffffffffec78;
  description_11.field_2._8_8_ = in_stack_ffffffffffffec80;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec98;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec88._0_8_;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec88._8_8_;
  RPCResult::RPCResult
            (&local_5d8,NUM,(string)(auVar9 << 0x20),SUB81(local_f58,0),description_11,inner_11,true
            );
  local_f98[0] = local_f88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f98,"estimated_feerate","");
  std::operator+(&local_fd8,"Estimated feerate of the final signed transaction in ",
                 &CURRENCY_UNIT_abi_cxx11_);
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_fd8,"/kvB. Shown only if all UTXO slots in the PSBT have been filled")
  ;
  local_fb8 = &local_fa8;
  psVar1 = (size_type *)(pbVar13->_M_dataplus)._M_p;
  paVar14 = &pbVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar14) {
    local_fa8 = paVar14->_M_allocated_capacity;
    uStack_fa0 = *(undefined8 *)((long)&pbVar13->field_2 + 8);
  }
  else {
    local_fa8 = paVar14->_M_allocated_capacity;
    local_fb8 = psVar1;
  }
  local_fb0 = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  auVar10._4_16_ = in_stack_ffffffffffffec50;
  auVar10._0_4_ = in_stack_ffffffffffffec4c;
  auVar10._20_8_ = in_RDI;
  auVar10._28_4_ = 0;
  description_12._M_string_length = in_stack_ffffffffffffec70;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec68;
  description_12.field_2._M_allocated_capacity = in_stack_ffffffffffffec78;
  description_12.field_2._8_8_ = in_stack_ffffffffffffec80;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec98;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec88._0_8_;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec88._8_8_;
  RPCResult::RPCResult
            (&local_550,STR_AMOUNT,(string)(auVar10 << 0x20),SUB81(local_f98,0),description_12,
             inner_12,true);
  local_ff8[0] = local_fe8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ff8,"fee","");
  local_1018[0] = local_1008;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1018,
             "The transaction fee paid. Shown only if all UTXO slots in the PSBT have been filled",
             "");
  uVar16 = 0;
  auVar11._4_16_ = in_stack_ffffffffffffec50;
  auVar11._0_4_ = in_stack_ffffffffffffec4c;
  auVar11._20_8_ = in_RDI;
  auVar11._28_4_ = 0;
  description_13._M_string_length = in_stack_ffffffffffffec70;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec68;
  description_13.field_2._M_allocated_capacity = in_stack_ffffffffffffec78;
  description_13.field_2._8_8_ = in_stack_ffffffffffffec80;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec98;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec88._0_8_;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec88._8_8_;
  RPCResult::RPCResult
            (&local_4c8,STR_AMOUNT,(string)(auVar11 << 0x20),SUB81(local_ff8,0),description_13,
             inner_13,true);
  local_1038 = local_1028;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1038,"next","");
  local_1058[0] = local_1048;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1058,"Role of the next person that this psbt needs to go to","");
  pRVar21 = (pointer)0x0;
  pRVar22 = (pointer)0x0;
  pRVar23 = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffec4c;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar16;
  m_key_name_04._8_16_ = in_stack_ffffffffffffec50;
  m_key_name_04.field_2._8_8_ = in_RDI;
  description_14._M_string_length = in_stack_ffffffffffffec70;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec68;
  description_14.field_2._M_allocated_capacity = in_stack_ffffffffffffec78;
  description_14.field_2._8_8_ = in_stack_ffffffffffffec80;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec98;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec88._0_8_;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec88._8_8_;
  RPCResult::RPCResult(&local_440,STR,m_key_name_04,description_14,inner_14,SUB81(&local_1038,0));
  local_1078[0] = local_1068;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1078,"error","");
  local_1098[0] = local_1088;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1098,"Error message (if there is one)","");
  pRVar18 = (pointer)0x0;
  pRVar19 = (pointer)0x0;
  pRVar20 = (pointer)0x0;
  uVar16 = 0;
  auVar12._4_16_ = in_stack_ffffffffffffec50;
  auVar12._0_4_ = in_stack_ffffffffffffec4c;
  auVar12._20_8_ = in_RDI;
  auVar12._28_4_ = 0;
  description_15._M_string_length = in_stack_ffffffffffffec70;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec68;
  description_15.field_2._M_allocated_capacity = in_stack_ffffffffffffec78;
  description_15.field_2._8_8_ = in_stack_ffffffffffffec80;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec88._0_8_;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec88._8_8_;
  RPCResult::RPCResult
            (&local_3b8,STR,(string)(auVar12 << 0x20),SUB81(local_1078,0),description_15,inner_15,
             true);
  __l_05._M_len = 6;
  __l_05._M_array = &local_660;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1168,__l_05,(allocator_type *)&stack0xffffffffffffec97);
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffec4c;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar16;
  m_key_name_05._8_16_ = in_stack_ffffffffffffec50;
  m_key_name_05.field_2._8_8_ = in_RDI;
  description_16._M_string_length = in_stack_ffffffffffffec70;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec68;
  description_16.field_2._M_allocated_capacity = in_stack_ffffffffffffec78;
  description_16.field_2._8_8_ = in_stack_ffffffffffffec80;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar18;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec88._0_8_;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec88._8_8_;
  RPCResult::RPCResult(&local_2f0,OBJ,m_key_name_05,description_16,inner_16,SUB81(local_310,0));
  result._4_4_ = in_stack_ffffffffffffec4c;
  result.m_type = uVar16;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec50._0_8_;
  result.m_key_name._M_string_length = in_stack_ffffffffffffec50._8_8_;
  result.m_key_name.field_2._M_allocated_capacity = (size_type)in_RDI;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffec68;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffec70;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffec78;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffec80;
  result.m_optional = (bool)in_stack_ffffffffffffec88[0];
  result.m_skip_type_check = (bool)in_stack_ffffffffffffec88[1];
  result._66_6_ = in_stack_ffffffffffffec88._2_6_;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec88._8_8_;
  result.m_description._M_string_length = (size_type)pRVar18;
  result.m_description.field_2._M_allocated_capacity = (size_type)pRVar19;
  result.m_description.field_2._8_8_ = pRVar20;
  result.m_cond._M_dataplus._M_p = (pointer)in_stack_ffffffffffffecb0;
  result.m_cond._M_string_length = (size_type)pRVar21;
  result.m_cond.field_2._M_allocated_capacity = (size_type)pRVar22;
  result.m_cond.field_2._8_8_ = pRVar23;
  RPCResults::RPCResults(&local_1150,result);
  local_10f8._M_dataplus._M_p = (pointer)&local_10f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_10f8,"analyzepsbt","");
  local_1118._M_dataplus._M_p = (pointer)&local_1118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1118,"\"psbt\"","");
  HelpExampleCli(&local_10d8,&local_10f8,&local_1118);
  paVar14 = &local_10d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10d8._M_dataplus._M_p == paVar14) {
    local_10a8._8_8_ = local_10d8.field_2._8_8_;
    local_10b8 = &local_10a8;
  }
  else {
    local_10b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_10d8._M_dataplus._M_p;
  }
  local_10a8._M_allocated_capacity._1_7_ = local_10d8.field_2._M_allocated_capacity._1_7_;
  local_10a8._M_local_buf[0] = local_10d8.field_2._M_local_buf[0];
  local_10b0 = local_10d8._M_string_length;
  local_10d8._M_string_length = 0;
  local_10d8.field_2._M_local_buf[0] = '\0';
  pcVar17 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:1864:9)>
            ::_M_manager;
  name_00._8_16_ = in_stack_ffffffffffffec50;
  name_00._M_dataplus._M_p = &stack0xffffffffffffec68;
  name_00.field_2._8_8_ = in_RDI;
  description_17.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:1864:9)>
       ::_M_manager;
  description_17._M_dataplus._M_p = (pointer)0x0;
  description_17._M_string_length = 0;
  description_17.field_2._8_8_ =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:1864:9)>
       ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar18;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffec88._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffec88._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar20;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar19;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffecb0;
  examples.m_examples._M_string_length = (size_type)pRVar22;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar21;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar23;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffecd0;
  local_10d8._M_dataplus._M_p = (pointer)paVar14;
  RPCHelpMan::RPCHelpMan
            (in_RDI,name_00,description_17,args,results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar17 != (code *)0x0) {
    (*pcVar17)(&stack0xffffffffffffec68,&stack0xffffffffffffec68,3);
  }
  if (local_10b8 != &local_10a8) {
    operator_delete(local_10b8,local_10a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10d8._M_dataplus._M_p != paVar14) {
    operator_delete(local_10d8._M_dataplus._M_p,
                    CONCAT71(local_10d8.field_2._M_allocated_capacity._1_7_,
                             local_10d8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1118._M_dataplus._M_p != &local_1118.field_2) {
    operator_delete(local_1118._M_dataplus._M_p,local_1118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10f8._M_dataplus._M_p != &local_10f8.field_2) {
    operator_delete(local_10f8._M_dataplus._M_p,local_10f8.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1150.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_cond._M_dataplus._M_p != &local_2f0.m_cond.field_2) {
    operator_delete(local_2f0.m_cond._M_dataplus._M_p,
                    local_2f0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_description._M_dataplus._M_p != &local_2f0.m_description.field_2) {
    operator_delete(local_2f0.m_description._M_dataplus._M_p,
                    local_2f0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2f0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_key_name._M_dataplus._M_p != &local_2f0.m_key_name.field_2) {
    operator_delete(local_2f0.m_key_name._M_dataplus._M_p,
                    local_2f0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1168);
  lVar15 = 0x330;
  do {
    if ((long *)((long)local_670 + lVar15) != *(long **)((long)local_680 + lVar15)) {
      operator_delete(*(long **)((long)local_680 + lVar15),*(long *)((long)local_670 + lVar15) + 1);
    }
    if ((long *)((long)local_690 + lVar15) != *(long **)((long)local_6a0 + lVar15)) {
      operator_delete(*(long **)((long)local_6a0 + lVar15),*(long *)((long)local_690 + lVar15) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)(local_728 + lVar15 + 0x68));
    if ((long *)(local_728 + lVar15 + 0x58) != *(long **)(local_728 + lVar15 + 0x48)) {
      operator_delete(*(long **)(local_728 + lVar15 + 0x48),*(long *)(local_728 + lVar15 + 0x58) + 1
                     );
    }
    lVar15 = lVar15 + -0x88;
  } while (lVar15 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffec98);
  if (local_1098[0] != local_1088) {
    operator_delete(local_1098[0],local_1088[0] + 1);
  }
  if (local_1078[0] != local_1068) {
    operator_delete(local_1078[0],local_1068[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffecb8);
  if (local_1058[0] != local_1048) {
    operator_delete(local_1058[0],local_1048[0] + 1);
  }
  if (local_1038 != local_1028) {
    operator_delete(local_1038,local_1028[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffecd8);
  if (local_1018[0] != local_1008) {
    operator_delete(local_1018[0],local_1008[0] + 1);
  }
  if (local_ff8[0] != local_fe8) {
    operator_delete(local_ff8[0],local_fe8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffecf8);
  if (local_fb8 != &local_fa8) {
    operator_delete(local_fb8,local_fa8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fd8._M_dataplus._M_p != &local_fd8.field_2) {
    operator_delete(local_fd8._M_dataplus._M_p,local_fd8.field_2._M_allocated_capacity + 1);
  }
  if (local_f98[0] != local_f88) {
    operator_delete(local_f98[0],local_f88[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffed18);
  if (local_f78[0] != local_f68) {
    operator_delete(local_f78[0],local_f68[0] + 1);
  }
  if (local_f58[0] != local_f48) {
    operator_delete(local_f58[0],local_f48[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._104_8_ != &local_6b0) {
    operator_delete((void *)local_728._104_8_,local_6b0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_728._72_8_ != local_728 + 0x58) {
    operator_delete((void *)local_728._72_8_,local_728._88_8_ + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)(local_728 + 0x28));
  if ((undefined1 *)local_728._8_8_ != local_728 + 0x18) {
    operator_delete((void *)local_728._8_8_,local_728._24_8_ + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1198);
  lVar15 = 0x220;
  do {
    if ((long *)(local_998 + lVar15) != *(long **)((long)local_9a8 + lVar15)) {
      operator_delete(*(long **)((long)local_9a8 + lVar15),*(long *)(local_998 + lVar15) + 1);
    }
    if ((long *)((long)local_9b8 + lVar15) != *(long **)((long)local_9c8 + lVar15)) {
      operator_delete(*(long **)((long)local_9c8 + lVar15),*(long *)((long)local_9b8 + lVar15) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_9e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar15));
    if ((long *)((long)local_9f8 + lVar15) != *(long **)((long)local_a08 + lVar15)) {
      operator_delete(*(long **)((long)local_a08 + lVar15),*(long *)((long)local_9f8 + lVar15) + 1);
    }
    lVar15 = lVar15 + -0x88;
  } while (lVar15 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12c8);
  if (local_f38[0] != local_f28) {
    operator_delete(local_f38[0],local_f28[0] + 1);
  }
  if (local_f18[0] != local_f08) {
    operator_delete(local_f18[0],local_f08[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_11f0);
  lVar15 = 0x220;
  do {
    if ((long *)((long)local_c78 + lVar15) != *(long **)((long)local_c88 + lVar15)) {
      operator_delete(*(long **)((long)local_c88 + lVar15),*(long *)((long)local_c78 + lVar15) + 1);
    }
    if ((long *)((long)local_c98 + lVar15) != *(long **)((long)local_ca8 + lVar15)) {
      operator_delete(*(long **)((long)local_ca8 + lVar15),*(long *)((long)local_c98 + lVar15) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)(local_d30 + lVar15 + 0x68));
    if ((long *)(local_d30 + lVar15 + 0x58) != *(long **)(local_d30 + lVar15 + 0x48)) {
      operator_delete(*(long **)(local_d30 + lVar15 + 0x48),*(long *)(local_d30 + lVar15 + 0x58) + 1
                     );
    }
    lVar15 = lVar15 + -0x88;
  } while (lVar15 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12a8);
  if (local_ef8[0] != local_ee8) {
    operator_delete(local_ef8[0],local_ee8[0] + 1);
  }
  if (local_ed8[0] != local_ec8) {
    operator_delete(local_ed8[0],local_ec8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1288);
  if (local_eb8[0] != local_ea8) {
    operator_delete(local_eb8[0],local_ea8[0] + 1);
  }
  if (local_e98[0] != local_e88) {
    operator_delete(local_e98[0],local_e88[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e38.m_cond._M_dataplus._M_p != &local_e38.m_cond.field_2) {
    operator_delete(local_e38.m_cond._M_dataplus._M_p,
                    local_e38.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e38.m_description._M_dataplus._M_p != &local_e38.m_description.field_2) {
    operator_delete(local_e38.m_description._M_dataplus._M_p,
                    local_e38.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_e38.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e38.m_key_name._M_dataplus._M_p != &local_e38.m_key_name.field_2) {
    operator_delete(local_e38.m_key_name._M_dataplus._M_p,
                    local_e38.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1268);
  if (local_e78[0] != local_e68) {
    operator_delete(local_e78[0],local_e68[0] + 1);
  }
  if (local_e58[0] != local_e48) {
    operator_delete(local_e58[0],local_e48[0] + 1);
  }
  if (local_db0[0] != local_da0) {
    operator_delete(local_db0[0],local_da0[0] + 1);
  }
  if (local_d90[0] != local_d80) {
    operator_delete(local_d90[0],local_d80[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d30._104_8_ != &local_cb8) {
    operator_delete((void *)local_d30._104_8_,local_cb8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_d30._72_8_ != local_d30 + 0x58) {
    operator_delete((void *)local_d30._72_8_,local_d30._88_8_ + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)(local_d30 + 0x28));
  if ((undefined1 *)local_d30._8_8_ != local_d30 + 0x18) {
    operator_delete((void *)local_d30._8_8_,local_d30._24_8_ + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1228);
  if (local_d70[0] != local_d60) {
    operator_delete(local_d70[0],local_d60[0] + 1);
  }
  if (local_d50[0] != local_d40) {
    operator_delete(local_d50[0],local_d40[0] + 1);
  }
  if (local_ca8[0] != local_c98) {
    operator_delete(local_ca8[0],local_c98[0] + 1);
  }
  if (local_c88[0] != local_c78) {
    operator_delete(local_c88[0],local_c78[0] + 1);
  }
  if (local_a48[0] != local_a38) {
    operator_delete(local_a48[0],local_a38[0] + 1);
  }
  if (local_a28[0] != local_a18) {
    operator_delete(local_a28[0],local_a18[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_11d8);
  if (local_a08[0] != local_9f8) {
    operator_delete(local_a08[0],local_9f8[0] + 1);
  }
  if (local_9e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_9e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_9e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_9e8.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_11b8);
  if (local_9c8[0] != local_9b8) {
    operator_delete(local_9c8[0],local_9b8[0] + 1);
  }
  if (local_9a8[0] != (pointer)local_998) {
    operator_delete(local_9a8[0],local_998._0_8_ + 1);
  }
  if (local_768[0] != local_758) {
    operator_delete(local_768[0],local_758[0] + 1);
  }
  if (local_748[0] != local_738) {
    operator_delete(local_748[0],local_738[0] + 1);
  }
  if (local_6a0[0] != local_690) {
    operator_delete(local_6a0[0],local_690[0] + 1);
  }
  if (local_680[0] != local_670) {
    operator_delete(local_680[0],local_670[0] + 1);
  }
  if (local_330[0] != local_320) {
    operator_delete(local_330[0],local_320[0] + 1);
  }
  if (local_310[0] != local_300) {
    operator_delete(local_310[0],local_300[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1130);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_180.m_opts.type_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_opts.oneline_description._M_dataplus._M_p !=
      &local_180.m_opts.oneline_description.field_2) {
    operator_delete(local_180.m_opts.oneline_description._M_dataplus._M_p,
                    local_180.m_opts.oneline_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_description._M_dataplus._M_p != &local_180.m_description.field_2) {
    operator_delete(local_180.m_description._M_dataplus._M_p,
                    local_180.m_description.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_180.m_fallback);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_180.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_names._M_dataplus._M_p != &local_180.m_names.field_2) {
    operator_delete(local_180.m_names._M_dataplus._M_p,
                    local_180.m_names.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_240);
  if (local_260 != &local_250) {
    operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
  }
  if (local_220[0] != local_210) {
    operator_delete(local_220[0],local_210[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_200._M_first);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan analyzepsbt()
{
    return RPCHelpMan{"analyzepsbt",
            "\nAnalyzes and provides information about the current status of a PSBT and its inputs\n",
            {
                {"psbt", RPCArg::Type::STR, RPCArg::Optional::NO, "A base64 string of a PSBT"}
            },
            RPCResult {
                RPCResult::Type::OBJ, "", "",
                {
                    {RPCResult::Type::ARR, "inputs", /*optional=*/true, "",
                    {
                        {RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::BOOL, "has_utxo", "Whether a UTXO is provided"},
                            {RPCResult::Type::BOOL, "is_final", "Whether the input is finalized"},
                            {RPCResult::Type::OBJ, "missing", /*optional=*/true, "Things that are missing that are required to complete this input",
                            {
                                {RPCResult::Type::ARR, "pubkeys", /*optional=*/true, "",
                                {
                                    {RPCResult::Type::STR_HEX, "keyid", "Public key ID, hash160 of the public key, of a public key whose BIP 32 derivation path is missing"},
                                }},
                                {RPCResult::Type::ARR, "signatures", /*optional=*/true, "",
                                {
                                    {RPCResult::Type::STR_HEX, "keyid", "Public key ID, hash160 of the public key, of a public key whose signature is missing"},
                                }},
                                {RPCResult::Type::STR_HEX, "redeemscript", /*optional=*/true, "Hash160 of the redeem script that is missing"},
                                {RPCResult::Type::STR_HEX, "witnessscript", /*optional=*/true, "SHA256 of the witness script that is missing"},
                            }},
                            {RPCResult::Type::STR, "next", /*optional=*/true, "Role of the next person that this input needs to go to"},
                        }},
                    }},
                    {RPCResult::Type::NUM, "estimated_vsize", /*optional=*/true, "Estimated vsize of the final signed transaction"},
                    {RPCResult::Type::STR_AMOUNT, "estimated_feerate", /*optional=*/true, "Estimated feerate of the final signed transaction in " + CURRENCY_UNIT + "/kvB. Shown only if all UTXO slots in the PSBT have been filled"},
                    {RPCResult::Type::STR_AMOUNT, "fee", /*optional=*/true, "The transaction fee paid. Shown only if all UTXO slots in the PSBT have been filled"},
                    {RPCResult::Type::STR, "next", "Role of the next person that this psbt needs to go to"},
                    {RPCResult::Type::STR, "error", /*optional=*/true, "Error message (if there is one)"},
                }
            },
            RPCExamples {
                HelpExampleCli("analyzepsbt", "\"psbt\"")
            },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    // Unserialize the transaction
    PartiallySignedTransaction psbtx;
    std::string error;
    if (!DecodeBase64PSBT(psbtx, request.params[0].get_str(), error)) {
        throw JSONRPCError(RPC_DESERIALIZATION_ERROR, strprintf("TX decode failed %s", error));
    }

    PSBTAnalysis psbta = AnalyzePSBT(psbtx);

    UniValue result(UniValue::VOBJ);
    UniValue inputs_result(UniValue::VARR);
    for (const auto& input : psbta.inputs) {
        UniValue input_univ(UniValue::VOBJ);
        UniValue missing(UniValue::VOBJ);

        input_univ.pushKV("has_utxo", input.has_utxo);
        input_univ.pushKV("is_final", input.is_final);
        input_univ.pushKV("next", PSBTRoleName(input.next));

        if (!input.missing_pubkeys.empty()) {
            UniValue missing_pubkeys_univ(UniValue::VARR);
            for (const CKeyID& pubkey : input.missing_pubkeys) {
                missing_pubkeys_univ.push_back(HexStr(pubkey));
            }
            missing.pushKV("pubkeys", std::move(missing_pubkeys_univ));
        }
        if (!input.missing_redeem_script.IsNull()) {
            missing.pushKV("redeemscript", HexStr(input.missing_redeem_script));
        }
        if (!input.missing_witness_script.IsNull()) {
            missing.pushKV("witnessscript", HexStr(input.missing_witness_script));
        }
        if (!input.missing_sigs.empty()) {
            UniValue missing_sigs_univ(UniValue::VARR);
            for (const CKeyID& pubkey : input.missing_sigs) {
                missing_sigs_univ.push_back(HexStr(pubkey));
            }
            missing.pushKV("signatures", std::move(missing_sigs_univ));
        }
        if (!missing.getKeys().empty()) {
            input_univ.pushKV("missing", std::move(missing));
        }
        inputs_result.push_back(std::move(input_univ));
    }
    if (!inputs_result.empty()) result.pushKV("inputs", std::move(inputs_result));

    if (psbta.estimated_vsize != std::nullopt) {
        result.pushKV("estimated_vsize", (int)*psbta.estimated_vsize);
    }
    if (psbta.estimated_feerate != std::nullopt) {
        result.pushKV("estimated_feerate", ValueFromAmount(psbta.estimated_feerate->GetFeePerK()));
    }
    if (psbta.fee != std::nullopt) {
        result.pushKV("fee", ValueFromAmount(*psbta.fee));
    }
    result.pushKV("next", PSBTRoleName(psbta.next));
    if (!psbta.error.empty()) {
        result.pushKV("error", psbta.error);
    }

    return result;
},
    };
}